

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void __thiscall miniros::Connection::drop(Connection *this,DropReason reason)

{
  DropWatchers *this_00;
  Connection *pCVar1;
  Connection *pCVar2;
  string local_48;
  
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (drop::loc.initialized_ == false) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"miniros.connection","");
    console::initializeLogLocation(&drop::loc,&local_48,Debug);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (drop::loc.level_ != Debug) {
    drop();
  }
  if (drop::loc.logger_enabled_ == true) {
    drop((Connection *)(ulong)reason);
  }
  if (((this->dropped_)._M_base._M_i & 1U) == 0) {
    LOCK();
    (this->dropped_)._M_base._M_i = true;
    UNLOCK();
    this_00 = &this->drop_watchers_;
    observer::TargetBase::lock(&this_00->super_TargetBase);
    pCVar1 = observer::TargetBase::objBegin(&this_00->super_TargetBase);
    while( true ) {
      pCVar2 = observer::TargetBase::objEnd(&this_00->super_TargetBase);
      if ((pCVar1 == (Connection *)0x0) || (pCVar1 == pCVar2)) break;
      std::__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<miniros::Connection,void>
                ((__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                 (__weak_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
      (*pCVar1->_vptr_Connection[2])(pCVar1,&local_48,(Connection *)(ulong)reason);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
      }
      pCVar1 = pCVar1->m_next;
    }
    observer::TargetBase::unlock(&this_00->super_TargetBase);
    (*((this->transport_).super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_Transport[8])();
  }
  return;
}

Assistant:

void Connection::drop(DropReason reason)
{
  MINIROS_DEBUG("Connection::drop(%u)", reason);
  bool did_drop = false;
  {
    if (!dropped_)
    {
      dropped_ = true;
      did_drop = true;
    }
  }

  if (did_drop)
  {
    {
        std::scoped_lock<DropWatchers> lock(drop_watchers_);
        for (auto it = drop_watchers_.begin(); it != drop_watchers_.end(); it++)
        {
            if (!it)
              break;
            it->onConnectionDropped(shared_from_this(), reason);
        }
    }
    transport_->close();
  }
}